

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O1

int runseasonalitytests(double *x,int N,int f,char *test)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double local_48;
  double stat;
  double crit;
  int f_local;
  
  crit._4_4_ = f;
  iVar1 = strcmp(test,"ocsb");
  if (iVar1 == 0) {
    OCSBtest(x,N,f,3,"aic",&local_48,&stat);
    bVar3 = local_48 == stat;
    bVar2 = local_48 < stat;
  }
  else {
    iVar1 = strcmp(test,"seas");
    if (iVar1 != 0) {
      return iVar1;
    }
    stat = 0.64;
    SHtest(x,N,(int *)((long)&crit + 4),1,&local_48);
    bVar3 = local_48 == stat;
    bVar2 = local_48 < stat;
  }
  return (uint)(!bVar2 && !bVar3);
}

Assistant:

static int runseasonalitytests(double *x, int N,int f, const char * test) {
    int diff,mlags;
    double stat,crit;
    const char *method;

    if (!strcmp(test,"ocsb")) {
        mlags = 3;
        method = "aic";
        OCSBtest(x,N,f,mlags,method,&stat,&crit);
        diff = (stat > crit) ? 1 : 0;
    } else if (!strcmp(test,"seas")) {
        crit = 0.64;
        SHtest(x,N,&f,1,&stat);
        diff = (stat > crit) ? 1 : 0;
    }

    return diff;
}